

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void nni_stat_inc(nni_stat_item *item,uint64_t inc)

{
  uint64_t inc_local;
  nni_stat_item *item_local;
  
  if ((item->si_info->field_0x18 & 1) == 0) {
    (item->si_u).sv_string = (item->si_u).sv_string + inc;
  }
  else {
    nni_atomic_add64(&(item->si_u).sv_atomic,inc);
  }
  return;
}

Assistant:

void
nni_stat_inc(nni_stat_item *item, uint64_t inc)
{
#ifdef NNG_ENABLE_STATS
	if (item->si_info->si_atomic) {
		nni_atomic_add64(&item->si_u.sv_atomic, inc);
	} else {
		item->si_u.sv_number += inc;
	}
#else
	NNI_ARG_UNUSED(item);
	NNI_ARG_UNUSED(inc);
#endif
}